

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Rational *a)

{
  ostream *poVar1;
  string local_30;
  
  Rational::toString_abi_cxx11_(&local_30,a);
  poVar1 = std::operator<<(out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Rational &a)
{
    return out << a.toString();
}